

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::GroupNorm_x86_avx::forward_inplace(GroupNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  void *pvVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  ulong uVar20;
  uint uVar21;
  long lVar22;
  float *pfVar23;
  undefined1 (*pauVar24) [32];
  float *pfVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 (*pauVar38) [32];
  ulong uVar39;
  long lVar40;
  __m128 x64;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar86 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar144;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar167;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar166 [64];
  undefined1 auVar168 [32];
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar169 [64];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar185 [32];
  
  auVar19 = _DAT_00597020;
  auVar18 = _DAT_00597000;
  iVar26 = bottom_top_blob->dims;
  uVar30 = (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_GroupNorm_x86_avx[-3]) /
           (long)*(int *)(&this->field_0xd0 + (long)this->_vptr_GroupNorm_x86_avx[-3]);
  uVar29 = uVar30 & 0xffffffff;
  uVar21 = (uint)uVar30;
  auVar96 = in_ZMM5._0_16_;
  if (iVar26 == 2) {
    pp_Var1 = this->_vptr_GroupNorm_x86_avx;
    p_Var2 = pp_Var1[-3];
    if (0 < *(int *)(&this->field_0xd0 + (long)p_Var2)) {
      uVar31 = bottom_top_blob->w;
      uVar33 = uVar31 * uVar21;
      uVar27 = uVar33 & 0xfffffff8;
      lVar35 = 0;
      auVar94._8_8_ = 0x8000000000000000;
      auVar94._0_8_ = 0x8000000000000000;
      auVar96 = vpcmpeqd_avx(auVar96,auVar96);
      do {
        lVar22 = lVar35 * (int)uVar21;
        pauVar38 = (undefined1 (*) [32])
                   (bottom_top_blob->w * lVar22 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        fVar150 = 0.0;
        fVar151 = 0.0;
        fVar144 = 0.0;
        fVar149 = 0.0;
        fVar152 = 0.0;
        fVar153 = 0.0;
        fVar154 = 0.0;
        fVar155 = 0.0;
        pauVar24 = pauVar38;
        uVar34 = 0;
        fVar170 = 0.0;
        fVar171 = 0.0;
        fVar172 = 0.0;
        fVar173 = 0.0;
        fVar174 = 0.0;
        fVar175 = 0.0;
        fVar176 = 0.0;
        fVar167 = 0.0;
        if (7 < (int)uVar33) {
          iVar26 = 7;
          do {
            fVar144 = fVar144 + *(float *)*pauVar24;
            fVar149 = fVar149 + *(float *)(*pauVar24 + 4);
            fVar150 = fVar150 + *(float *)(*pauVar24 + 8);
            fVar151 = fVar151 + *(float *)(*pauVar24 + 0xc);
            fVar152 = fVar152 + *(float *)(*pauVar24 + 0x10);
            fVar153 = fVar153 + *(float *)(*pauVar24 + 0x14);
            fVar154 = fVar154 + *(float *)(*pauVar24 + 0x18);
            fVar155 = fVar155 + *(float *)(*pauVar24 + 0x1c);
            pauVar24 = pauVar24 + 1;
            iVar26 = iVar26 + 8;
            uVar34 = uVar27;
            fVar170 = fVar144;
            fVar171 = fVar149;
            fVar172 = fVar150;
            fVar173 = fVar151;
            fVar174 = fVar152;
            fVar175 = fVar153;
            fVar176 = fVar154;
            fVar167 = fVar155;
          } while (iVar26 < (int)uVar33);
        }
        uVar28 = uVar34 | 3;
        auVar79 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar150 = auVar79._4_4_;
          fVar151 = auVar79._8_4_;
          fVar144 = auVar79._12_4_;
          if ((int)uVar33 <= (int)uVar28) break;
          auVar79._0_4_ = auVar79._0_4_ + *(float *)*pauVar24;
          auVar79._4_4_ = fVar150 + *(float *)(*pauVar24 + 4);
          auVar79._8_4_ = fVar151 + *(float *)(*pauVar24 + 8);
          auVar79._12_4_ = fVar144 + *(float *)(*pauVar24 + 0xc);
          pauVar24 = (undefined1 (*) [32])(*pauVar24 + 0x10);
          uVar28 = uVar34 + 7;
          uVar34 = uVar34 + 4;
        }
        auVar106._0_4_ = fVar170 + fVar174;
        auVar106._4_4_ = fVar171 + fVar175;
        auVar106._8_4_ = fVar172 + fVar176;
        auVar106._12_4_ = fVar173 + fVar167;
        auVar81 = vshufpd_avx(auVar106,auVar106,1);
        auVar107._0_4_ = auVar81._0_4_ + auVar106._0_4_;
        auVar107._4_4_ = auVar81._4_4_ + auVar106._4_4_;
        auVar107._8_4_ = auVar81._8_4_ + auVar106._8_4_;
        auVar107._12_4_ = auVar81._12_4_ + auVar106._12_4_;
        auVar81 = vshufpd_avx(auVar79,auVar79,1);
        auVar80._0_4_ = auVar81._0_4_ + auVar79._0_4_;
        auVar80._4_4_ = auVar81._4_4_ + fVar150;
        auVar80._8_4_ = auVar81._8_4_ + fVar151;
        auVar80._12_4_ = auVar81._12_4_ + fVar144;
        auVar79 = vhaddps_avx(auVar107,auVar107);
        auVar81 = vmovshdup_avx(auVar80);
        fVar150 = auVar79._0_4_ + auVar81._0_4_ + auVar80._0_4_;
        if ((int)uVar34 < (int)uVar33) {
          uVar30 = CONCAT44(0,~uVar34 + uVar33);
          auVar79 = vblendps_avx(ZEXT416((uint)fVar150),_DAT_00594030,0xe);
          auVar81._8_8_ = 0;
          auVar81._0_8_ = uVar30;
          auVar106 = vpshufd_avx(auVar81,0x44);
          auVar81 = vorps_avx(auVar106,auVar94);
          auVar80 = vorps_avx(auVar106,auVar94);
          uVar29 = 0;
          auVar92 = ZEXT1664(auVar79);
          do {
            auVar166 = auVar92;
            auVar82._8_8_ = 0;
            auVar82._0_8_ = uVar29;
            auVar79 = vpshufd_avx(auVar82,0x44);
            auVar88._16_16_ = auVar79;
            auVar88._0_16_ = auVar79;
            auVar119 = vorps_avx(auVar88,auVar18);
            auVar88 = vorps_avx(auVar88,auVar19);
            auVar79 = vorps_avx(auVar106,auVar94);
            auVar108._8_4_ = auVar88._24_4_;
            auVar108._0_8_ = auVar88._16_8_ ^ 0x8000000000000000;
            auVar108._12_4_ = auVar88._28_4_ ^ 0x80000000;
            auVar82 = vpcmpgtq_avx(auVar108,auVar79);
            auVar83._8_4_ = auVar88._8_4_;
            auVar137._8_4_ = auVar83._8_4_;
            auVar137._0_8_ = auVar88._0_8_ ^ 0x8000000000000000;
            auVar137._12_4_ = auVar88._12_4_ ^ 0x80000000;
            auVar107 = vpcmpgtq_avx(auVar137,auVar81);
            auVar107 = vpackssdw_avx(auVar107,auVar82);
            auVar188._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
            auVar188._8_4_ = auVar119._24_4_;
            auVar188._12_4_ = auVar119._28_4_ ^ 0x80000000;
            auVar108 = vpcmpgtq_avx(auVar188,auVar79);
            auVar189._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
            auVar189._8_4_ = auVar119._8_4_;
            auVar189._12_4_ = auVar119._12_4_ ^ 0x80000000;
            auVar79 = vpcmpgtq_avx(auVar189,auVar80);
            auVar79 = vpackssdw_avx(auVar79,auVar108);
            auVar79 = vpackssdw_avx(auVar79 ^ auVar96,auVar107 ^ auVar96);
            auVar107 = vpmovsxwd_avx(auVar79);
            auVar79 = vpunpckhwd_avx(auVar79,auVar79);
            auVar143._16_16_ = auVar79;
            auVar143._0_16_ = auVar107;
            auVar143 = vmaskmovps_avx(auVar143,*(undefined1 (*) [32])(*pauVar24 + uVar29 * 4));
            auVar146._0_4_ = auVar143._0_4_ + auVar166._0_4_;
            auVar146._4_4_ = auVar143._4_4_ + auVar166._4_4_;
            auVar146._8_4_ = auVar143._8_4_ + auVar166._8_4_;
            auVar146._12_4_ = auVar143._12_4_ + auVar166._12_4_;
            auVar148._16_4_ = auVar143._16_4_ + auVar166._16_4_;
            auVar148._0_16_ = auVar146;
            auVar148._20_4_ = auVar143._20_4_ + auVar166._20_4_;
            auVar148._24_4_ = auVar143._24_4_ + auVar166._24_4_;
            auVar148._28_4_ = auVar143._28_4_ + auVar166._28_4_;
            uVar29 = uVar29 + 8;
            auVar92 = ZEXT3264(auVar148);
          } while ((uVar30 + 8 & 0x1fffffff8) != uVar29);
          auVar79 = vorps_avx(auVar106,auVar94);
          auVar83._0_8_ = auVar88._0_8_ ^ 0x8000000000000000;
          auVar83._12_4_ = auVar88._12_4_ ^ 0x80000000;
          auVar79 = vpcmpgtq_avx(auVar83,auVar79);
          auVar81 = vpackssdw_avx(auVar79,auVar82);
          auVar79 = vorps_avx(auVar106,auVar94);
          auVar159._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
          auVar159._8_4_ = auVar119._8_4_;
          auVar159._12_4_ = auVar119._12_4_ ^ 0x80000000;
          auVar79 = vpcmpgtq_avx(auVar159,auVar79);
          auVar79 = vpackssdw_avx(auVar79,auVar108);
          auVar79 = vblendvps_avx(auVar166._0_16_,auVar146,auVar79 ^ auVar96);
          auVar81 = vblendvps_avx(auVar166._16_16_,auVar148._16_16_,auVar81 ^ auVar96);
          auVar79 = vhaddps_avx(auVar81,auVar79);
          auVar79 = vhaddps_avx(auVar79,auVar79);
          auVar79 = vhaddps_avx(auVar79,auVar79);
          fVar150 = auVar79._0_4_;
        }
        fVar150 = (1.0 / (float)(int)uVar33) * fVar150;
        auVar79 = vshufps_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150),0);
        pauVar24 = pauVar38;
        if ((int)uVar33 < 8) {
          fVar151 = 0.0;
          fVar170 = 0.0;
          fVar171 = 0.0;
          fVar172 = 0.0;
          fVar173 = 0.0;
          fVar174 = 0.0;
          fVar175 = 0.0;
          fVar176 = 0.0;
          uVar34 = 0;
        }
        else {
          auVar119._16_16_ = auVar79;
          auVar119._0_16_ = auVar79;
          fVar151 = 0.0;
          fVar170 = 0.0;
          fVar171 = 0.0;
          fVar172 = 0.0;
          fVar173 = 0.0;
          fVar174 = 0.0;
          fVar175 = 0.0;
          fVar176 = 0.0;
          iVar26 = 7;
          do {
            auVar88 = vsubps_avx(*pauVar24,auVar119);
            fVar151 = fVar151 + auVar88._0_4_ * auVar88._0_4_;
            fVar170 = fVar170 + auVar88._4_4_ * auVar88._4_4_;
            fVar171 = fVar171 + auVar88._8_4_ * auVar88._8_4_;
            fVar172 = fVar172 + auVar88._12_4_ * auVar88._12_4_;
            fVar173 = fVar173 + auVar88._16_4_ * auVar88._16_4_;
            fVar174 = fVar174 + auVar88._20_4_ * auVar88._20_4_;
            fVar175 = fVar175 + auVar88._24_4_ * auVar88._24_4_;
            fVar176 = fVar176 + auVar88._28_4_;
            pauVar24 = pauVar24 + 1;
            iVar26 = iVar26 + 8;
            uVar34 = uVar27;
          } while (iVar26 < (int)uVar33);
        }
        uVar28 = uVar34 | 3;
        auVar178 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar167 = auVar178._4_4_;
          fVar144 = auVar178._8_4_;
          fVar149 = auVar178._12_4_;
          if ((int)uVar33 <= (int)uVar28) break;
          auVar81 = vsubps_avx(*(undefined1 (*) [16])*pauVar24,auVar79);
          auVar178._0_4_ = auVar178._0_4_ + auVar81._0_4_ * auVar81._0_4_;
          auVar178._4_4_ = fVar167 + auVar81._4_4_ * auVar81._4_4_;
          auVar178._8_4_ = fVar144 + auVar81._8_4_ * auVar81._8_4_;
          auVar178._12_4_ = fVar149 + auVar81._12_4_ * auVar81._12_4_;
          pauVar24 = (undefined1 (*) [32])(*pauVar24 + 0x10);
          uVar28 = uVar34 + 7;
          uVar34 = uVar34 + 4;
        }
        auVar109._0_4_ = fVar151 + fVar173;
        auVar109._4_4_ = fVar170 + fVar174;
        auVar109._8_4_ = fVar171 + fVar175;
        auVar109._12_4_ = fVar172 + fVar176;
        auVar81 = vshufpd_avx(auVar109,auVar109,1);
        auVar110._0_4_ = auVar81._0_4_ + auVar109._0_4_;
        auVar110._4_4_ = auVar81._4_4_ + auVar109._4_4_;
        auVar110._8_4_ = auVar81._8_4_ + auVar109._8_4_;
        auVar110._12_4_ = auVar81._12_4_ + auVar109._12_4_;
        auVar81 = vshufpd_avx(auVar178,auVar178,1);
        auVar125._0_4_ = auVar178._0_4_ + auVar81._0_4_;
        auVar125._4_4_ = fVar167 + auVar81._4_4_;
        auVar125._8_4_ = fVar144 + auVar81._8_4_;
        auVar125._12_4_ = fVar149 + auVar81._12_4_;
        auVar81 = vhaddps_avx(auVar110,auVar110);
        auVar80 = vmovshdup_avx(auVar125);
        fVar151 = auVar80._0_4_ + auVar81._0_4_ + auVar125._0_4_;
        if ((int)uVar34 < (int)uVar33) {
          uVar29 = CONCAT44(0,~uVar34 + uVar33);
          auVar81 = vblendps_avx(ZEXT416((uint)fVar151),_DAT_00594030,0xe);
          auVar111._8_8_ = 0;
          auVar111._0_8_ = uVar29;
          auVar106 = vpshufd_avx(auVar111,0x44);
          auVar180._16_16_ = auVar79;
          auVar180._0_16_ = auVar79;
          auVar79 = vorps_avx(auVar106,auVar94);
          auVar80 = vorps_avx(auVar106,auVar94);
          uVar30 = 0;
          auVar92 = ZEXT1664(auVar81);
          do {
            auVar166 = auVar92;
            auVar112._8_8_ = 0;
            auVar112._0_8_ = uVar30;
            auVar81 = vpshufd_avx(auVar112,0x44);
            auVar120._16_16_ = auVar81;
            auVar120._0_16_ = auVar81;
            auVar119 = vorps_avx(auVar120,auVar18);
            auVar88 = vorps_avx(auVar120,auVar19);
            auVar81 = vorps_avx(auVar106,auVar94);
            auVar126._0_8_ = auVar88._16_8_ ^ 0x8000000000000000;
            auVar126._8_4_ = auVar88._24_4_;
            auVar126._12_4_ = auVar88._28_4_ ^ 0x80000000;
            auVar82 = vpcmpgtq_avx(auVar126,auVar81);
            auVar160._0_8_ = auVar88._0_8_ ^ 0x8000000000000000;
            auVar113._8_4_ = auVar88._8_4_;
            auVar160._8_4_ = auVar113._8_4_;
            auVar160._12_4_ = auVar88._12_4_ ^ 0x80000000;
            auVar107 = vpcmpgtq_avx(auVar160,auVar79);
            auVar107 = vpackssdw_avx(auVar107,auVar82);
            auVar46._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
            auVar46._8_4_ = auVar119._24_4_;
            auVar46._12_4_ = auVar119._28_4_ ^ 0x80000000;
            auVar108 = vpcmpgtq_avx(auVar46,auVar81);
            auVar47._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
            auVar47._8_4_ = auVar119._8_4_;
            auVar47._12_4_ = auVar119._12_4_ ^ 0x80000000;
            auVar81 = vpcmpgtq_avx(auVar47,auVar80);
            auVar81 = vpackssdw_avx(auVar81,auVar108);
            auVar81 = vpackssdw_avx(auVar81 ^ auVar96,auVar107 ^ auVar96);
            auVar107 = vpmovsxwd_avx(auVar81);
            auVar81 = vpunpckhwd_avx(auVar81,auVar81);
            auVar67._16_16_ = auVar81;
            auVar67._0_16_ = auVar107;
            auVar143 = vmaskmovps_avx(auVar67,*(undefined1 (*) [32])(*pauVar24 + uVar30 * 4));
            auVar143 = vsubps_avx(auVar143,auVar180);
            auVar161._0_4_ = auVar143._0_4_ * auVar143._0_4_ + auVar166._0_4_;
            auVar161._4_4_ = auVar143._4_4_ * auVar143._4_4_ + auVar166._4_4_;
            auVar161._8_4_ = auVar143._8_4_ * auVar143._8_4_ + auVar166._8_4_;
            auVar161._12_4_ = auVar143._12_4_ * auVar143._12_4_ + auVar166._12_4_;
            auVar164._16_4_ = auVar143._16_4_ * auVar143._16_4_ + auVar166._16_4_;
            auVar164._0_16_ = auVar161;
            auVar164._20_4_ = auVar143._20_4_ * auVar143._20_4_ + auVar166._20_4_;
            auVar164._24_4_ = auVar143._24_4_ * auVar143._24_4_ + auVar166._24_4_;
            auVar164._28_4_ = auVar143._28_4_ + auVar166._28_4_;
            uVar30 = uVar30 + 8;
            auVar92 = ZEXT3264(auVar164);
          } while ((uVar29 + 8 & 0x1fffffff8) != uVar30);
          auVar79 = vorps_avx(auVar106,auVar94);
          auVar113._0_8_ = auVar88._0_8_ ^ 0x8000000000000000;
          auVar113._12_4_ = auVar88._12_4_ ^ 0x80000000;
          auVar79 = vpcmpgtq_avx(auVar113,auVar79);
          auVar81 = vpackssdw_avx(auVar79,auVar82);
          auVar79 = vorps_avx(auVar106,auVar94);
          auVar127._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
          auVar127._8_4_ = auVar119._8_4_;
          auVar127._12_4_ = auVar119._12_4_ ^ 0x80000000;
          auVar79 = vpcmpgtq_avx(auVar127,auVar79);
          auVar79 = vpackssdw_avx(auVar79,auVar108);
          auVar79 = vblendvps_avx(auVar166._0_16_,auVar161,auVar79 ^ auVar96);
          auVar81 = vblendvps_avx(auVar166._16_16_,auVar164._16_16_,auVar81 ^ auVar96);
          auVar79 = vhaddps_avx(auVar81,auVar79);
          auVar79 = vhaddps_avx(auVar79,auVar79);
          auVar79 = vhaddps_avx(auVar79,auVar79);
          fVar151 = auVar79._0_4_;
        }
        fVar151 = (1.0 / (float)(int)uVar33) * fVar151 +
                  *(float *)(&this->field_0xd8 + (long)p_Var2);
        auVar79 = vrsqrtss_avx(ZEXT416((uint)fVar151),ZEXT416((uint)fVar151));
        fVar170 = auVar79._0_4_;
        fVar151 = fVar170 * -0.5 * (fVar151 * fVar170 * fVar170 + -3.0);
        fVar170 = 0.0;
        fVar150 = fVar151 * -fVar150;
        if (*(int *)(&this->field_0xdc + (long)p_Var2) == 0) {
          auVar79 = vshufps_avx(ZEXT416((uint)fVar151),ZEXT416((uint)fVar151),0);
          auVar81 = vshufps_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150),0);
          fVar150 = auVar81._0_4_;
          fVar151 = auVar81._4_4_;
          fVar171 = auVar81._8_4_;
          fVar172 = auVar81._12_4_;
          fVar173 = auVar79._0_4_;
          fVar174 = auVar79._4_4_;
          fVar175 = auVar79._8_4_;
          fVar176 = auVar79._12_4_;
          uVar34 = 0;
          if (7 < (int)uVar33) {
            iVar26 = 7;
            do {
              fVar167 = *(float *)(*pauVar38 + 4);
              fVar144 = *(float *)(*pauVar38 + 8);
              fVar149 = *(float *)(*pauVar38 + 0xc);
              fVar152 = *(float *)(*pauVar38 + 0x10);
              fVar153 = *(float *)(*pauVar38 + 0x14);
              fVar154 = *(float *)(*pauVar38 + 0x18);
              fVar170 = fVar170 + fVar172;
              *(float *)*pauVar38 = fVar173 * *(float *)*pauVar38 + fVar150;
              *(float *)(*pauVar38 + 4) = fVar174 * fVar167 + fVar151;
              *(float *)(*pauVar38 + 8) = fVar175 * fVar144 + fVar171;
              *(float *)(*pauVar38 + 0xc) = fVar176 * fVar149 + fVar172;
              *(float *)(*pauVar38 + 0x10) = fVar173 * fVar152 + fVar150;
              *(float *)(*pauVar38 + 0x14) = fVar174 * fVar153 + fVar151;
              *(float *)(*pauVar38 + 0x18) = fVar175 * fVar154 + fVar171;
              *(float *)(*pauVar38 + 0x1c) = fVar170;
              pauVar38 = pauVar38 + 1;
              iVar26 = iVar26 + 8;
              uVar34 = uVar27;
            } while (iVar26 < (int)uVar33);
          }
          uVar28 = uVar34 | 3;
          while ((int)uVar28 < (int)uVar33) {
            fVar170 = *(float *)(*pauVar38 + 4);
            fVar167 = *(float *)(*pauVar38 + 8);
            fVar144 = *(float *)(*pauVar38 + 0xc);
            *(float *)*pauVar38 = fVar150 + fVar173 * *(float *)*pauVar38;
            *(float *)(*pauVar38 + 4) = fVar151 + fVar174 * fVar170;
            *(float *)(*pauVar38 + 8) = fVar171 + fVar175 * fVar167;
            *(float *)(*pauVar38 + 0xc) = fVar172 + fVar176 * fVar144;
            pauVar38 = (undefined1 (*) [32])(*pauVar38 + 0x10);
            uVar28 = uVar34 + 7;
            uVar34 = uVar34 + 4;
          }
          if ((int)uVar34 < (int)uVar33) {
            uVar29 = CONCAT44(0,~uVar34 + uVar33);
            auVar48._8_8_ = 0;
            auVar48._0_8_ = uVar29;
            auVar80 = vpshufd_avx(auVar48,0x44);
            auVar79 = vorps_avx(auVar80,auVar94);
            auVar81 = vorps_avx(auVar80,auVar94);
            uVar30 = 0;
            do {
              auVar49._8_8_ = 0;
              auVar49._0_8_ = uVar30;
              auVar106 = vpshufd_avx(auVar49,0x44);
              auVar68._16_16_ = auVar106;
              auVar68._0_16_ = auVar106;
              auVar119 = vorps_avx(auVar68,auVar18);
              auVar88 = vorps_avx(auVar68,auVar19);
              auVar106 = vorps_avx(auVar80,auVar94);
              auVar138._0_8_ = auVar88._16_8_ ^ 0x8000000000000000;
              auVar138._8_4_ = auVar88._24_4_;
              auVar138._12_4_ = auVar88._28_4_ ^ 0x80000000;
              auVar107 = vpcmpgtq_avx(auVar138,auVar106);
              auVar50._0_8_ = auVar88._0_8_ ^ 0x8000000000000000;
              auVar50._8_4_ = auVar88._8_4_;
              auVar50._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar82 = vpcmpgtq_avx(auVar50,auVar79);
              auVar107 = vpackssdw_avx(auVar82,auVar107);
              auVar139._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
              auVar139._8_4_ = auVar119._24_4_;
              auVar139._12_4_ = auVar119._28_4_ ^ 0x80000000;
              auVar106 = vpcmpgtq_avx(auVar139,auVar106);
              auVar114._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
              auVar114._8_4_ = auVar119._8_4_;
              auVar114._12_4_ = auVar119._12_4_ ^ 0x80000000;
              auVar82 = vpcmpgtq_avx(auVar114,auVar81);
              auVar106 = vpackssdw_avx(auVar82,auVar106);
              auVar106 = vpackssdw_avx(auVar106 ^ auVar96,auVar107 ^ auVar96);
              auVar107 = vpmovsxwd_avx(auVar106);
              auVar106 = vpunpckhwd_avx(auVar106,auVar106);
              auVar69._16_16_ = auVar106;
              auVar69._0_16_ = auVar107;
              auVar119 = vmaskmovps_avx(auVar69,*(undefined1 (*) [32])(*pauVar38 + uVar30 * 4));
              auVar121._0_4_ = fVar150 + fVar173 * auVar119._0_4_;
              auVar121._4_4_ = fVar151 + fVar174 * auVar119._4_4_;
              auVar121._8_4_ = fVar171 + fVar175 * auVar119._8_4_;
              auVar121._12_4_ = fVar172 + fVar176 * auVar119._12_4_;
              auVar121._16_4_ = fVar150 + fVar173 * auVar119._16_4_;
              auVar121._20_4_ = fVar151 + fVar174 * auVar119._20_4_;
              auVar121._24_4_ = fVar171 + fVar175 * auVar119._24_4_;
              auVar121._28_4_ = fVar172 + auVar119._28_4_;
              auVar119 = vmaskmovps_avx(auVar69,auVar121);
              *(undefined1 (*) [32])(*pauVar38 + uVar30 * 4) = auVar119;
              uVar30 = uVar30 + 8;
            } while ((uVar29 + 8 & 0x1fffffff8) != uVar30);
          }
        }
        else if (0 < (int)uVar21) {
          pfVar23 = (float *)(*(long *)(&this->field_0xf0 + (long)p_Var2) * lVar22 +
                             *(long *)(&this->field_0xe0 + (long)p_Var2));
          pfVar25 = (float *)(lVar22 * *(long *)(&this->field_0x138 + (long)p_Var2) +
                             *(long *)(&this->field_0x128 + (long)p_Var2));
          uVar34 = 0;
          do {
            fVar172 = 0.0;
            fVar170 = fVar150 * *pfVar23 + *pfVar25;
            fVar171 = fVar151 * *pfVar23;
            auVar79 = vshufps_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),0);
            auVar81 = vshufps_avx(ZEXT416((uint)fVar170),ZEXT416((uint)fVar170),0);
            fVar176 = auVar81._0_4_;
            fVar167 = auVar81._4_4_;
            fVar144 = auVar81._8_4_;
            fVar149 = auVar81._12_4_;
            fVar173 = auVar79._0_4_;
            fVar174 = auVar79._4_4_;
            fVar175 = auVar79._8_4_;
            if ((int)uVar31 < 8) {
              uVar28 = 0;
            }
            else {
              iVar26 = 7;
              do {
                fVar152 = *(float *)(*pauVar38 + 4);
                fVar153 = *(float *)(*pauVar38 + 8);
                fVar154 = *(float *)(*pauVar38 + 0xc);
                fVar155 = *(float *)(*pauVar38 + 0x10);
                fVar5 = *(float *)(*pauVar38 + 0x14);
                fVar6 = *(float *)(*pauVar38 + 0x18);
                fVar172 = fVar172 + fVar149;
                *(float *)*pauVar38 = fVar173 * *(float *)*pauVar38 + fVar176;
                *(float *)(*pauVar38 + 4) = fVar174 * fVar152 + fVar167;
                *(float *)(*pauVar38 + 8) = fVar175 * fVar153 + fVar144;
                *(float *)(*pauVar38 + 0xc) = auVar79._12_4_ * fVar154 + fVar149;
                *(float *)(*pauVar38 + 0x10) = fVar173 * fVar155 + fVar176;
                *(float *)(*pauVar38 + 0x14) = fVar174 * fVar5 + fVar167;
                *(float *)(*pauVar38 + 0x18) = fVar175 * fVar6 + fVar144;
                *(float *)(*pauVar38 + 0x1c) = fVar172;
                pauVar38 = pauVar38 + 1;
                iVar26 = iVar26 + 8;
                uVar28 = uVar31 & 0xfffffff8;
              } while (iVar26 < (int)uVar31);
            }
            uVar32 = uVar28 | 3;
            while ((int)uVar32 < (int)uVar31) {
              fVar172 = *(float *)(*pauVar38 + 4);
              fVar152 = *(float *)(*pauVar38 + 8);
              fVar153 = *(float *)(*pauVar38 + 0xc);
              *(float *)*pauVar38 = fVar176 + fVar173 * *(float *)*pauVar38;
              *(float *)(*pauVar38 + 4) = fVar167 + fVar174 * fVar172;
              *(float *)(*pauVar38 + 8) = fVar144 + fVar175 * fVar152;
              *(float *)(*pauVar38 + 0xc) = fVar149 + auVar79._12_4_ * fVar153;
              pauVar38 = (undefined1 (*) [32])(*pauVar38 + 0x10);
              uVar32 = uVar28 + 7;
              uVar28 = uVar28 + 4;
            }
            iVar26 = uVar31 - uVar28;
            if (iVar26 != 0 && (int)uVar28 <= (int)uVar31) {
              do {
                *(float *)*pauVar38 = fVar170 + fVar171 * *(float *)*pauVar38;
                pauVar38 = (undefined1 (*) [32])(*pauVar38 + 4);
                iVar26 = iVar26 + -1;
              } while (iVar26 != 0);
            }
            pfVar23 = pfVar23 + 1;
            pfVar25 = pfVar25 + 1;
            uVar34 = uVar34 + 1;
          } while (uVar34 != uVar21);
        }
        lVar35 = lVar35 + 1;
        p_Var2 = pp_Var1[-3];
      } while (lVar35 < *(int *)(&this->field_0xd0 + (long)p_Var2));
    }
  }
  else if (iVar26 == 1) {
    pp_Var1 = this->_vptr_GroupNorm_x86_avx;
    p_Var2 = pp_Var1[-3];
    if (0 < *(int *)(&this->field_0xd0 + (long)p_Var2)) {
      uVar31 = uVar21 & 0xfffffff8;
      lVar35 = 0;
      auVar93._8_8_ = 0x8000000000000000;
      auVar93._0_8_ = 0x8000000000000000;
      auVar96 = vpcmpeqd_avx(auVar96,auVar96);
      do {
        lVar22 = lVar35 * (int)uVar21;
        pauVar38 = (undefined1 (*) [32])
                   (bottom_top_blob->elemsize * lVar22 + (long)bottom_top_blob->data);
        fVar150 = 0.0;
        fVar151 = 0.0;
        fVar144 = 0.0;
        fVar149 = 0.0;
        fVar152 = 0.0;
        fVar153 = 0.0;
        fVar154 = 0.0;
        fVar155 = 0.0;
        pauVar24 = pauVar38;
        uVar33 = 0;
        fVar170 = 0.0;
        fVar171 = 0.0;
        fVar172 = 0.0;
        fVar173 = 0.0;
        fVar174 = 0.0;
        fVar175 = 0.0;
        fVar176 = 0.0;
        fVar167 = 0.0;
        if (7 < (int)uVar21) {
          iVar26 = 7;
          do {
            fVar144 = fVar144 + *(float *)*pauVar24;
            fVar149 = fVar149 + *(float *)(*pauVar24 + 4);
            fVar150 = fVar150 + *(float *)(*pauVar24 + 8);
            fVar151 = fVar151 + *(float *)(*pauVar24 + 0xc);
            fVar152 = fVar152 + *(float *)(*pauVar24 + 0x10);
            fVar153 = fVar153 + *(float *)(*pauVar24 + 0x14);
            fVar154 = fVar154 + *(float *)(*pauVar24 + 0x18);
            fVar155 = fVar155 + *(float *)(*pauVar24 + 0x1c);
            pauVar24 = pauVar24 + 1;
            iVar26 = iVar26 + 8;
            uVar33 = uVar31;
            fVar170 = fVar144;
            fVar171 = fVar149;
            fVar172 = fVar150;
            fVar173 = fVar151;
            fVar174 = fVar152;
            fVar175 = fVar153;
            fVar176 = fVar154;
            fVar167 = fVar155;
          } while (iVar26 < (int)uVar21);
        }
        uVar27 = uVar33 | 3;
        auVar74 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar150 = auVar74._4_4_;
          fVar151 = auVar74._8_4_;
          fVar144 = auVar74._12_4_;
          if ((int)uVar21 <= (int)uVar27) break;
          auVar74._0_4_ = auVar74._0_4_ + *(float *)*pauVar24;
          auVar74._4_4_ = fVar150 + *(float *)(*pauVar24 + 4);
          auVar74._8_4_ = fVar151 + *(float *)(*pauVar24 + 8);
          auVar74._12_4_ = fVar144 + *(float *)(*pauVar24 + 0xc);
          pauVar24 = (undefined1 (*) [32])(*pauVar24 + 0x10);
          uVar27 = uVar33 + 7;
          uVar33 = uVar33 + 4;
        }
        auVar97._0_4_ = fVar170 + fVar174;
        auVar97._4_4_ = fVar171 + fVar175;
        auVar97._8_4_ = fVar172 + fVar176;
        auVar97._12_4_ = fVar173 + fVar167;
        auVar94 = vshufpd_avx(auVar97,auVar97,1);
        auVar98._0_4_ = auVar94._0_4_ + auVar97._0_4_;
        auVar98._4_4_ = auVar94._4_4_ + auVar97._4_4_;
        auVar98._8_4_ = auVar94._8_4_ + auVar97._8_4_;
        auVar98._12_4_ = auVar94._12_4_ + auVar97._12_4_;
        auVar94 = vshufpd_avx(auVar74,auVar74,1);
        auVar75._0_4_ = auVar94._0_4_ + auVar74._0_4_;
        auVar75._4_4_ = auVar94._4_4_ + fVar150;
        auVar75._8_4_ = auVar94._8_4_ + fVar151;
        auVar75._12_4_ = auVar94._12_4_ + fVar144;
        auVar94 = vhaddps_avx(auVar98,auVar98);
        auVar79 = vmovshdup_avx(auVar75);
        fVar150 = auVar94._0_4_ + auVar79._0_4_ + auVar75._0_4_;
        if ((int)uVar33 < (int)uVar21) {
          uVar30 = CONCAT44(0,~uVar33 + uVar21);
          auVar94 = vblendps_avx(ZEXT416((uint)fVar150),_DAT_00594030,0xe);
          auVar76._8_8_ = 0;
          auVar76._0_8_ = uVar30;
          auVar80 = vpshufd_avx(auVar76,0x44);
          auVar79 = vorps_avx(auVar80,auVar93);
          auVar81 = vorps_avx(auVar80,auVar93);
          uVar29 = 0;
          auVar92 = ZEXT1664(auVar94);
          do {
            auVar166 = auVar92;
            auVar77._8_8_ = 0;
            auVar77._0_8_ = uVar29;
            auVar94 = vpshufd_avx(auVar77,0x44);
            auVar87._16_16_ = auVar94;
            auVar87._0_16_ = auVar94;
            auVar119 = vorps_avx(auVar87,auVar18);
            auVar88 = vorps_avx(auVar87,auVar19);
            auVar94 = vorps_avx(auVar80,auVar93);
            auVar99._8_4_ = auVar88._24_4_;
            auVar99._0_8_ = auVar88._16_8_ ^ 0x8000000000000000;
            auVar99._12_4_ = auVar88._28_4_ ^ 0x80000000;
            auVar107 = vpcmpgtq_avx(auVar99,auVar94);
            auVar78._8_4_ = auVar88._8_4_;
            auVar134._8_4_ = auVar78._8_4_;
            auVar134._0_8_ = auVar88._0_8_ ^ 0x8000000000000000;
            auVar134._12_4_ = auVar88._12_4_ ^ 0x80000000;
            auVar106 = vpcmpgtq_avx(auVar134,auVar79);
            auVar106 = vpackssdw_avx(auVar106,auVar107);
            auVar186._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
            auVar186._8_4_ = auVar119._24_4_;
            auVar186._12_4_ = auVar119._28_4_ ^ 0x80000000;
            auVar82 = vpcmpgtq_avx(auVar186,auVar94);
            auVar187._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
            auVar187._8_4_ = auVar119._8_4_;
            auVar187._12_4_ = auVar119._12_4_ ^ 0x80000000;
            auVar94 = vpcmpgtq_avx(auVar187,auVar81);
            auVar94 = vpackssdw_avx(auVar94,auVar82);
            auVar94 = vpackssdw_avx(auVar94 ^ auVar96,auVar106 ^ auVar96);
            auVar106 = vpmovsxwd_avx(auVar94);
            auVar94 = vpunpckhwd_avx(auVar94,auVar94);
            auVar142._16_16_ = auVar94;
            auVar142._0_16_ = auVar106;
            auVar143 = vmaskmovps_avx(auVar142,*(undefined1 (*) [32])(*pauVar24 + uVar29 * 4));
            auVar145._0_4_ = auVar143._0_4_ + auVar166._0_4_;
            auVar145._4_4_ = auVar143._4_4_ + auVar166._4_4_;
            auVar145._8_4_ = auVar143._8_4_ + auVar166._8_4_;
            auVar145._12_4_ = auVar143._12_4_ + auVar166._12_4_;
            auVar147._16_4_ = auVar143._16_4_ + auVar166._16_4_;
            auVar147._0_16_ = auVar145;
            auVar147._20_4_ = auVar143._20_4_ + auVar166._20_4_;
            auVar147._24_4_ = auVar143._24_4_ + auVar166._24_4_;
            auVar147._28_4_ = auVar143._28_4_ + auVar166._28_4_;
            uVar29 = uVar29 + 8;
            auVar92 = ZEXT3264(auVar147);
          } while ((uVar30 + 8 & 0x1fffffff8) != uVar29);
          auVar94 = vorps_avx(auVar80,auVar93);
          auVar78._0_8_ = auVar88._0_8_ ^ 0x8000000000000000;
          auVar78._12_4_ = auVar88._12_4_ ^ 0x80000000;
          auVar94 = vpcmpgtq_avx(auVar78,auVar94);
          auVar79 = vpackssdw_avx(auVar94,auVar107);
          auVar94 = vorps_avx(auVar80,auVar93);
          auVar156._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
          auVar156._8_4_ = auVar119._8_4_;
          auVar156._12_4_ = auVar119._12_4_ ^ 0x80000000;
          auVar94 = vpcmpgtq_avx(auVar156,auVar94);
          auVar94 = vpackssdw_avx(auVar94,auVar82);
          auVar94 = vblendvps_avx(auVar166._0_16_,auVar145,auVar94 ^ auVar96);
          auVar79 = vblendvps_avx(auVar166._16_16_,auVar147._16_16_,auVar79 ^ auVar96);
          auVar94 = vhaddps_avx(auVar79,auVar94);
          auVar94 = vhaddps_avx(auVar94,auVar94);
          auVar94 = vhaddps_avx(auVar94,auVar94);
          fVar150 = auVar94._0_4_;
        }
        fVar150 = (1.0 / (float)(int)uVar21) * fVar150;
        auVar94 = vshufps_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150),0);
        pauVar24 = pauVar38;
        if ((int)uVar21 < 8) {
          fVar151 = 0.0;
          fVar170 = 0.0;
          fVar171 = 0.0;
          fVar172 = 0.0;
          fVar173 = 0.0;
          fVar174 = 0.0;
          fVar175 = 0.0;
          fVar176 = 0.0;
          uVar33 = 0;
        }
        else {
          auVar116._16_16_ = auVar94;
          auVar116._0_16_ = auVar94;
          fVar151 = 0.0;
          fVar170 = 0.0;
          fVar171 = 0.0;
          fVar172 = 0.0;
          fVar173 = 0.0;
          fVar174 = 0.0;
          fVar175 = 0.0;
          fVar176 = 0.0;
          iVar26 = 7;
          do {
            auVar119 = vsubps_avx(*pauVar24,auVar116);
            fVar151 = fVar151 + auVar119._0_4_ * auVar119._0_4_;
            fVar170 = fVar170 + auVar119._4_4_ * auVar119._4_4_;
            fVar171 = fVar171 + auVar119._8_4_ * auVar119._8_4_;
            fVar172 = fVar172 + auVar119._12_4_ * auVar119._12_4_;
            fVar173 = fVar173 + auVar119._16_4_ * auVar119._16_4_;
            fVar174 = fVar174 + auVar119._20_4_ * auVar119._20_4_;
            fVar175 = fVar175 + auVar119._24_4_ * auVar119._24_4_;
            fVar176 = fVar176 + auVar119._28_4_;
            pauVar24 = pauVar24 + 1;
            iVar26 = iVar26 + 8;
            uVar33 = uVar31;
          } while (iVar26 < (int)uVar21);
        }
        uVar27 = uVar33 | 3;
        auVar177 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar167 = auVar177._4_4_;
          fVar144 = auVar177._8_4_;
          fVar149 = auVar177._12_4_;
          if ((int)uVar21 <= (int)uVar27) break;
          auVar79 = vsubps_avx(*(undefined1 (*) [16])*pauVar24,auVar94);
          auVar177._0_4_ = auVar177._0_4_ + auVar79._0_4_ * auVar79._0_4_;
          auVar177._4_4_ = fVar167 + auVar79._4_4_ * auVar79._4_4_;
          auVar177._8_4_ = fVar144 + auVar79._8_4_ * auVar79._8_4_;
          auVar177._12_4_ = fVar149 + auVar79._12_4_ * auVar79._12_4_;
          pauVar24 = (undefined1 (*) [32])(*pauVar24 + 0x10);
          uVar27 = uVar33 + 7;
          uVar33 = uVar33 + 4;
        }
        auVar100._0_4_ = fVar151 + fVar173;
        auVar100._4_4_ = fVar170 + fVar174;
        auVar100._8_4_ = fVar171 + fVar175;
        auVar100._12_4_ = fVar172 + fVar176;
        auVar79 = vshufpd_avx(auVar100,auVar100,1);
        auVar101._0_4_ = auVar79._0_4_ + auVar100._0_4_;
        auVar101._4_4_ = auVar79._4_4_ + auVar100._4_4_;
        auVar101._8_4_ = auVar79._8_4_ + auVar100._8_4_;
        auVar101._12_4_ = auVar79._12_4_ + auVar100._12_4_;
        auVar79 = vshufpd_avx(auVar177,auVar177,1);
        auVar122._0_4_ = auVar177._0_4_ + auVar79._0_4_;
        auVar122._4_4_ = fVar167 + auVar79._4_4_;
        auVar122._8_4_ = fVar144 + auVar79._8_4_;
        auVar122._12_4_ = fVar149 + auVar79._12_4_;
        auVar79 = vhaddps_avx(auVar101,auVar101);
        auVar81 = vmovshdup_avx(auVar122);
        fVar151 = auVar81._0_4_ + auVar79._0_4_ + auVar122._0_4_;
        if ((int)uVar33 < (int)uVar21) {
          uVar29 = CONCAT44(0,~uVar33 + uVar21);
          auVar79 = vblendps_avx(ZEXT416((uint)fVar151),_DAT_00594030,0xe);
          auVar102._8_8_ = 0;
          auVar102._0_8_ = uVar29;
          auVar80 = vpshufd_avx(auVar102,0x44);
          auVar179._16_16_ = auVar94;
          auVar179._0_16_ = auVar94;
          auVar94 = vorps_avx(auVar80,auVar93);
          auVar81 = vorps_avx(auVar80,auVar93);
          uVar30 = 0;
          auVar92 = ZEXT1664(auVar79);
          do {
            auVar166 = auVar92;
            auVar103._8_8_ = 0;
            auVar103._0_8_ = uVar30;
            auVar79 = vpshufd_avx(auVar103,0x44);
            auVar117._16_16_ = auVar79;
            auVar117._0_16_ = auVar79;
            auVar119 = vorps_avx(auVar117,auVar18);
            auVar88 = vorps_avx(auVar117,auVar19);
            auVar79 = vorps_avx(auVar80,auVar93);
            auVar123._0_8_ = auVar88._16_8_ ^ 0x8000000000000000;
            auVar123._8_4_ = auVar88._24_4_;
            auVar123._12_4_ = auVar88._28_4_ ^ 0x80000000;
            auVar107 = vpcmpgtq_avx(auVar123,auVar79);
            auVar157._0_8_ = auVar88._0_8_ ^ 0x8000000000000000;
            auVar104._8_4_ = auVar88._8_4_;
            auVar157._8_4_ = auVar104._8_4_;
            auVar157._12_4_ = auVar88._12_4_ ^ 0x80000000;
            auVar106 = vpcmpgtq_avx(auVar157,auVar94);
            auVar106 = vpackssdw_avx(auVar106,auVar107);
            auVar41._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
            auVar41._8_4_ = auVar119._24_4_;
            auVar41._12_4_ = auVar119._28_4_ ^ 0x80000000;
            auVar82 = vpcmpgtq_avx(auVar41,auVar79);
            auVar42._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
            auVar42._8_4_ = auVar119._8_4_;
            auVar42._12_4_ = auVar119._12_4_ ^ 0x80000000;
            auVar79 = vpcmpgtq_avx(auVar42,auVar81);
            auVar79 = vpackssdw_avx(auVar79,auVar82);
            auVar79 = vpackssdw_avx(auVar79 ^ auVar96,auVar106 ^ auVar96);
            auVar106 = vpmovsxwd_avx(auVar79);
            auVar79 = vpunpckhwd_avx(auVar79,auVar79);
            auVar64._16_16_ = auVar79;
            auVar64._0_16_ = auVar106;
            auVar143 = vmaskmovps_avx(auVar64,*(undefined1 (*) [32])(*pauVar24 + uVar30 * 4));
            auVar143 = vsubps_avx(auVar143,auVar179);
            auVar158._0_4_ = auVar143._0_4_ * auVar143._0_4_ + auVar166._0_4_;
            auVar158._4_4_ = auVar143._4_4_ * auVar143._4_4_ + auVar166._4_4_;
            auVar158._8_4_ = auVar143._8_4_ * auVar143._8_4_ + auVar166._8_4_;
            auVar158._12_4_ = auVar143._12_4_ * auVar143._12_4_ + auVar166._12_4_;
            auVar163._16_4_ = auVar143._16_4_ * auVar143._16_4_ + auVar166._16_4_;
            auVar163._0_16_ = auVar158;
            auVar163._20_4_ = auVar143._20_4_ * auVar143._20_4_ + auVar166._20_4_;
            auVar163._24_4_ = auVar143._24_4_ * auVar143._24_4_ + auVar166._24_4_;
            auVar163._28_4_ = auVar143._28_4_ + auVar166._28_4_;
            uVar30 = uVar30 + 8;
            auVar92 = ZEXT3264(auVar163);
          } while ((uVar29 + 8 & 0x1fffffff8) != uVar30);
          auVar94 = vorps_avx(auVar80,auVar93);
          auVar104._0_8_ = auVar88._0_8_ ^ 0x8000000000000000;
          auVar104._12_4_ = auVar88._12_4_ ^ 0x80000000;
          auVar94 = vpcmpgtq_avx(auVar104,auVar94);
          auVar79 = vpackssdw_avx(auVar94,auVar107);
          auVar94 = vorps_avx(auVar80,auVar93);
          auVar124._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
          auVar124._8_4_ = auVar119._8_4_;
          auVar124._12_4_ = auVar119._12_4_ ^ 0x80000000;
          auVar94 = vpcmpgtq_avx(auVar124,auVar94);
          auVar94 = vpackssdw_avx(auVar94,auVar82);
          auVar94 = vblendvps_avx(auVar166._0_16_,auVar158,auVar94 ^ auVar96);
          auVar79 = vblendvps_avx(auVar166._16_16_,auVar163._16_16_,auVar79 ^ auVar96);
          auVar94 = vhaddps_avx(auVar79,auVar94);
          auVar94 = vhaddps_avx(auVar94,auVar94);
          auVar94 = vhaddps_avx(auVar94,auVar94);
          fVar151 = auVar94._0_4_;
        }
        fVar151 = (1.0 / (float)(int)uVar21) * fVar151 +
                  *(float *)(&this->field_0xd8 + (long)p_Var2);
        auVar94 = vrsqrtss_avx(ZEXT416((uint)fVar151),ZEXT416((uint)fVar151));
        fVar170 = auVar94._0_4_;
        fVar151 = fVar170 * -0.5 * (fVar151 * fVar170 * fVar170 + -3.0);
        fVar170 = 0.0;
        fVar150 = fVar151 * -fVar150;
        auVar94 = vshufps_avx(ZEXT416((uint)fVar151),ZEXT416((uint)fVar151),0);
        auVar79 = vshufps_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150),0);
        fVar171 = auVar94._0_4_;
        fVar172 = auVar94._4_4_;
        fVar173 = auVar94._8_4_;
        fVar174 = auVar94._12_4_;
        fVar175 = auVar79._0_4_;
        fVar176 = auVar79._4_4_;
        fVar167 = auVar79._8_4_;
        fVar144 = auVar79._12_4_;
        if (*(int *)(&this->field_0xdc + (long)p_Var2) == 0) {
          uVar33 = 0;
          if (7 < (int)uVar21) {
            iVar26 = 7;
            do {
              fVar150 = *(float *)(*pauVar38 + 4);
              fVar151 = *(float *)(*pauVar38 + 8);
              fVar149 = *(float *)(*pauVar38 + 0xc);
              fVar152 = *(float *)(*pauVar38 + 0x10);
              fVar153 = *(float *)(*pauVar38 + 0x14);
              fVar154 = *(float *)(*pauVar38 + 0x18);
              fVar170 = fVar144 + fVar170;
              *(float *)*pauVar38 = fVar175 + fVar171 * *(float *)*pauVar38;
              *(float *)(*pauVar38 + 4) = fVar176 + fVar172 * fVar150;
              *(float *)(*pauVar38 + 8) = fVar167 + fVar173 * fVar151;
              *(float *)(*pauVar38 + 0xc) = fVar144 + fVar174 * fVar149;
              *(float *)(*pauVar38 + 0x10) = fVar175 + fVar171 * fVar152;
              *(float *)(*pauVar38 + 0x14) = fVar176 + fVar172 * fVar153;
              *(float *)(*pauVar38 + 0x18) = fVar167 + fVar173 * fVar154;
              *(float *)(*pauVar38 + 0x1c) = fVar170;
              pauVar38 = pauVar38 + 1;
              iVar26 = iVar26 + 8;
              uVar33 = uVar31;
            } while (iVar26 < (int)uVar21);
          }
          uVar27 = uVar33 | 3;
          while ((int)uVar27 < (int)uVar21) {
            fVar150 = *(float *)(*pauVar38 + 4);
            fVar151 = *(float *)(*pauVar38 + 8);
            fVar170 = *(float *)(*pauVar38 + 0xc);
            *(float *)*pauVar38 = fVar175 + fVar171 * *(float *)*pauVar38;
            *(float *)(*pauVar38 + 4) = fVar176 + fVar172 * fVar150;
            *(float *)(*pauVar38 + 8) = fVar167 + fVar173 * fVar151;
            *(float *)(*pauVar38 + 0xc) = fVar144 + fVar174 * fVar170;
            pauVar38 = (undefined1 (*) [32])(*pauVar38 + 0x10);
            uVar27 = uVar33 + 7;
            uVar33 = uVar33 + 4;
          }
          if ((int)uVar33 < (int)uVar21) {
            uVar30 = CONCAT44(0,~uVar33 + uVar21);
            auVar43._8_8_ = 0;
            auVar43._0_8_ = uVar30;
            auVar81 = vpshufd_avx(auVar43,0x44);
            auVar94 = vorps_avx(auVar81,auVar93);
            auVar79 = vorps_avx(auVar81,auVar93);
            uVar29 = 0;
            do {
              auVar44._8_8_ = 0;
              auVar44._0_8_ = uVar29;
              auVar80 = vpshufd_avx(auVar44,0x44);
              auVar65._16_16_ = auVar80;
              auVar65._0_16_ = auVar80;
              auVar119 = vorps_avx(auVar65,auVar18);
              auVar88 = vorps_avx(auVar65,auVar19);
              auVar80 = vorps_avx(auVar81,auVar93);
              auVar135._0_8_ = auVar88._16_8_ ^ 0x8000000000000000;
              auVar135._8_4_ = auVar88._24_4_;
              auVar135._12_4_ = auVar88._28_4_ ^ 0x80000000;
              auVar106 = vpcmpgtq_avx(auVar135,auVar80);
              auVar45._0_8_ = auVar88._0_8_ ^ 0x8000000000000000;
              auVar45._8_4_ = auVar88._8_4_;
              auVar45._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar107 = vpcmpgtq_avx(auVar45,auVar94);
              auVar106 = vpackssdw_avx(auVar107,auVar106);
              auVar136._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
              auVar136._8_4_ = auVar119._24_4_;
              auVar136._12_4_ = auVar119._28_4_ ^ 0x80000000;
              auVar80 = vpcmpgtq_avx(auVar136,auVar80);
              auVar105._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
              auVar105._8_4_ = auVar119._8_4_;
              auVar105._12_4_ = auVar119._12_4_ ^ 0x80000000;
              auVar107 = vpcmpgtq_avx(auVar105,auVar79);
              auVar80 = vpackssdw_avx(auVar107,auVar80);
              auVar80 = vpackssdw_avx(auVar80 ^ auVar96,auVar106 ^ auVar96);
              auVar106 = vpmovsxwd_avx(auVar80);
              auVar80 = vpunpckhwd_avx(auVar80,auVar80);
              auVar66._16_16_ = auVar80;
              auVar66._0_16_ = auVar106;
              auVar119 = vmaskmovps_avx(auVar66,*(undefined1 (*) [32])(*pauVar38 + uVar29 * 4));
              auVar118._0_4_ = fVar175 + fVar171 * auVar119._0_4_;
              auVar118._4_4_ = fVar176 + fVar172 * auVar119._4_4_;
              auVar118._8_4_ = fVar167 + fVar173 * auVar119._8_4_;
              auVar118._12_4_ = fVar144 + fVar174 * auVar119._12_4_;
              auVar118._16_4_ = fVar175 + fVar171 * auVar119._16_4_;
              auVar118._20_4_ = fVar176 + fVar172 * auVar119._20_4_;
              auVar118._24_4_ = fVar167 + fVar173 * auVar119._24_4_;
              auVar118._28_4_ = fVar144 + auVar119._28_4_;
              auVar119 = vmaskmovps_avx(auVar66,auVar118);
              *(undefined1 (*) [32])(*pauVar38 + uVar29 * 4) = auVar119;
              uVar29 = uVar29 + 8;
            } while ((uVar30 + 8 & 0x1fffffff8) != uVar29);
          }
        }
        else {
          pfVar25 = (float *)(*(long *)(&this->field_0xf0 + (long)p_Var2) * lVar22 +
                             *(long *)(&this->field_0xe0 + (long)p_Var2));
          pfVar23 = (float *)(lVar22 * *(long *)(&this->field_0x138 + (long)p_Var2) +
                             *(long *)(&this->field_0x128 + (long)p_Var2));
          uVar33 = 0;
          if (7 < (int)uVar21) {
            iVar26 = 7;
            do {
              fVar149 = *(float *)(*pauVar38 + 4);
              fVar152 = *(float *)(*pauVar38 + 8);
              fVar153 = *(float *)(*pauVar38 + 0xc);
              fVar154 = *(float *)(*pauVar38 + 0x10);
              fVar155 = *(float *)(*pauVar38 + 0x14);
              fVar5 = *(float *)(*pauVar38 + 0x18);
              fVar6 = pfVar25[1];
              fVar7 = pfVar25[2];
              fVar8 = pfVar25[3];
              fVar9 = pfVar25[4];
              fVar10 = pfVar25[5];
              fVar11 = pfVar25[6];
              fVar12 = pfVar23[1];
              fVar13 = pfVar23[2];
              fVar14 = pfVar23[3];
              fVar15 = pfVar23[4];
              fVar16 = pfVar23[5];
              fVar17 = pfVar23[6];
              fVar170 = fVar144 + fVar170 + pfVar23[7];
              *(float *)*pauVar38 = (fVar175 + fVar171 * *(float *)*pauVar38) * *pfVar25 + *pfVar23;
              *(float *)(*pauVar38 + 4) = (fVar176 + fVar172 * fVar149) * fVar6 + fVar12;
              *(float *)(*pauVar38 + 8) = (fVar167 + fVar173 * fVar152) * fVar7 + fVar13;
              *(float *)(*pauVar38 + 0xc) = (fVar144 + fVar174 * fVar153) * fVar8 + fVar14;
              *(float *)(*pauVar38 + 0x10) = (fVar175 + fVar171 * fVar154) * fVar9 + fVar15;
              *(float *)(*pauVar38 + 0x14) = (fVar176 + fVar172 * fVar155) * fVar10 + fVar16;
              *(float *)(*pauVar38 + 0x18) = (fVar167 + fVar173 * fVar5) * fVar11 + fVar17;
              *(float *)(*pauVar38 + 0x1c) = fVar170;
              pfVar25 = pfVar25 + 8;
              pfVar23 = pfVar23 + 8;
              pauVar38 = pauVar38 + 1;
              iVar26 = iVar26 + 8;
              uVar33 = uVar31;
            } while (iVar26 < (int)uVar21);
          }
          uVar27 = uVar33 | 3;
          while ((int)uVar27 < (int)uVar21) {
            fVar170 = *(float *)(*pauVar38 + 4);
            fVar149 = *(float *)(*pauVar38 + 8);
            fVar152 = *(float *)(*pauVar38 + 0xc);
            fVar153 = pfVar25[1];
            fVar154 = pfVar25[2];
            fVar155 = pfVar25[3];
            fVar5 = pfVar23[1];
            fVar6 = pfVar23[2];
            fVar7 = pfVar23[3];
            *(float *)*pauVar38 = (fVar175 + fVar171 * *(float *)*pauVar38) * *pfVar25 + *pfVar23;
            *(float *)(*pauVar38 + 4) = (fVar176 + fVar172 * fVar170) * fVar153 + fVar5;
            *(float *)(*pauVar38 + 8) = (fVar167 + fVar173 * fVar149) * fVar154 + fVar6;
            *(float *)(*pauVar38 + 0xc) = (fVar144 + fVar174 * fVar152) * fVar155 + fVar7;
            pfVar25 = pfVar25 + 4;
            pfVar23 = pfVar23 + 4;
            pauVar38 = (undefined1 (*) [32])(*pauVar38 + 0x10);
            uVar27 = uVar33 + 7;
            uVar33 = uVar33 + 4;
          }
          if ((int)uVar33 < (int)uVar21) {
            lVar22 = 0;
            do {
              *(float *)(*pauVar38 + lVar22 * 4) =
                   (fVar150 + fVar151 * *(float *)(*pauVar38 + lVar22 * 4)) * pfVar25[lVar22] +
                   pfVar23[lVar22];
              lVar22 = lVar22 + 1;
            } while (uVar21 - uVar33 != (int)lVar22);
          }
        }
        lVar35 = lVar35 + 1;
        p_Var2 = pp_Var1[-3];
      } while (lVar35 < *(int *)(&this->field_0xd0 + (long)p_Var2));
    }
  }
  else if (iVar26 - 3U < 2) {
    pp_Var1 = this->_vptr_GroupNorm_x86_avx;
    p_Var2 = pp_Var1[-3];
    if (0 < *(int *)(&this->field_0xd0 + (long)p_Var2)) {
      uVar33 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pp_Var3 = this->_vptr_GroupNorm_x86_avx;
      uVar31 = uVar33 & 0xfffffff8;
      auVar92 = ZEXT464(0x3f800000);
      fVar150 = 1.0 / (float)(int)(uVar33 * uVar21);
      lVar35 = 0;
      auVar95._8_8_ = 0x8000000000000000;
      auVar95._0_8_ = 0x8000000000000000;
      auVar96 = vpcmpeqd_avx(auVar96,auVar96);
      do {
        lVar40 = lVar35 * (int)uVar21;
        uVar30 = bottom_top_blob->elemsize;
        lVar22 = bottom_top_blob->cstep * lVar40 * uVar30;
        pvVar4 = bottom_top_blob->data;
        uVar20 = ((long)bottom_top_blob->d * uVar30 *
                  (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0) /
                 uVar30;
        fVar170 = 0.0;
        auVar166 = ZEXT1664(ZEXT816(0) << 0x40);
        fVar151 = 0.0;
        if (0 < (int)uVar21) {
          uVar39 = 0;
          do {
            pfVar23 = (float *)((long)pvVar4 + uVar20 * uVar30 * uVar39 + lVar22);
            if ((int)uVar33 < 8) {
              auVar168 = SUB6432(ZEXT864(0),0);
              uVar27 = 0;
            }
            else {
              auVar169 = ZEXT864(0);
              iVar26 = 7;
              do {
                auVar168._0_4_ = auVar169._0_4_ + *pfVar23;
                auVar168._4_4_ = auVar169._4_4_ + pfVar23[1];
                auVar168._8_4_ = auVar169._8_4_ + pfVar23[2];
                auVar168._12_4_ = auVar169._12_4_ + pfVar23[3];
                auVar168._16_4_ = auVar169._16_4_ + pfVar23[4];
                auVar168._20_4_ = auVar169._20_4_ + pfVar23[5];
                auVar168._24_4_ = auVar169._24_4_ + pfVar23[6];
                auVar168._28_4_ = auVar169._28_4_ + pfVar23[7];
                auVar169 = ZEXT3264(auVar168);
                pfVar23 = pfVar23 + 8;
                iVar26 = iVar26 + 8;
                uVar27 = uVar31;
              } while (iVar26 < (int)uVar33);
            }
            uVar34 = uVar27 | 3;
            auVar140 = ZEXT816(0) << 0x40;
            while( true ) {
              fVar151 = auVar140._4_4_;
              fVar171 = auVar140._8_4_;
              fVar172 = auVar140._12_4_;
              if ((int)uVar33 <= (int)uVar34) break;
              auVar140._0_4_ = auVar140._0_4_ + *pfVar23;
              auVar140._4_4_ = fVar151 + pfVar23[1];
              auVar140._8_4_ = fVar171 + pfVar23[2];
              auVar140._12_4_ = fVar172 + pfVar23[3];
              pfVar23 = pfVar23 + 4;
              uVar34 = uVar27 + 7;
              uVar27 = uVar27 + 4;
            }
            auVar51._0_4_ = auVar168._0_4_ + auVar168._16_4_;
            auVar51._4_4_ = auVar168._4_4_ + auVar168._20_4_;
            auVar51._8_4_ = auVar168._8_4_ + auVar168._24_4_;
            auVar51._12_4_ = auVar168._12_4_ + auVar168._28_4_;
            auVar94 = vshufpd_avx(auVar51,auVar51,1);
            auVar52._0_4_ = auVar94._0_4_ + auVar51._0_4_;
            auVar52._4_4_ = auVar94._4_4_ + auVar51._4_4_;
            auVar52._8_4_ = auVar94._8_4_ + auVar51._8_4_;
            auVar52._12_4_ = auVar94._12_4_ + auVar51._12_4_;
            auVar94 = vmovshdup_avx(auVar52);
            auVar79 = vshufpd_avx(auVar140,auVar140,1);
            auVar128._0_4_ = auVar140._0_4_ + auVar79._0_4_;
            auVar128._4_4_ = fVar151 + auVar79._4_4_;
            auVar128._8_4_ = fVar171 + auVar79._8_4_;
            auVar128._12_4_ = fVar172 + auVar79._12_4_;
            auVar79 = vmovshdup_avx(auVar128);
            fVar151 = auVar79._0_4_ +
                      auVar166._0_4_ + auVar94._0_4_ + auVar52._0_4_ + auVar128._0_4_;
            auVar166 = ZEXT464((uint)fVar151);
            if ((int)uVar27 < (int)uVar33) {
              uVar37 = CONCAT44(0,~uVar27 + uVar33);
              auVar94 = vblendps_avx(ZEXT416((uint)fVar151),_DAT_00594030,0xe);
              auVar53._8_8_ = 0;
              auVar53._0_8_ = uVar37;
              auVar80 = vpshufd_avx(auVar53,0x44);
              auVar79 = vorps_avx(auVar80,auVar95);
              auVar81 = vorps_avx(auVar80,auVar95);
              uVar36 = 0;
              auVar166 = ZEXT1664(auVar94);
              do {
                auVar169 = auVar166;
                auVar54._8_8_ = 0;
                auVar54._0_8_ = uVar36;
                auVar94 = vpshufd_avx(auVar54,0x44);
                auVar70._16_16_ = auVar94;
                auVar70._0_16_ = auVar94;
                auVar119 = vorps_avx(auVar70,auVar18);
                auVar88 = vorps_avx(auVar70,auVar19);
                auVar94 = vorps_avx(auVar80,auVar95);
                auVar55._8_4_ = auVar88._24_4_;
                auVar55._0_8_ = auVar88._16_8_ ^ 0x8000000000000000;
                auVar55._12_4_ = auVar88._28_4_ ^ 0x80000000;
                auVar107 = vpcmpgtq_avx(auVar55,auVar94);
                auVar115._8_4_ = auVar88._8_4_;
                auVar190._8_4_ = auVar115._8_4_;
                auVar190._0_8_ = auVar88._0_8_ ^ 0x8000000000000000;
                auVar190._12_4_ = auVar88._12_4_ ^ 0x80000000;
                auVar106 = vpcmpgtq_avx(auVar190,auVar79);
                auVar106 = vpackssdw_avx(auVar106,auVar107);
                auVar193._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
                auVar193._8_4_ = auVar119._24_4_;
                auVar193._12_4_ = auVar119._28_4_ ^ 0x80000000;
                auVar82 = vpcmpgtq_avx(auVar193,auVar94);
                auVar194._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
                auVar194._8_4_ = auVar119._8_4_;
                auVar194._12_4_ = auVar119._12_4_ ^ 0x80000000;
                auVar94 = vpcmpgtq_avx(auVar194,auVar81);
                auVar94 = vpackssdw_avx(auVar94,auVar82);
                auVar94 = vpackssdw_avx(auVar94 ^ auVar96,auVar106 ^ auVar96);
                auVar106 = vpmovsxwd_avx(auVar94);
                auVar94 = vpunpckhwd_avx(auVar94,auVar94);
                auVar192._16_16_ = auVar94;
                auVar192._0_16_ = auVar106;
                auVar143 = vmaskmovps_avx(auVar192,*(undefined1 (*) [32])(pfVar23 + uVar36));
                auVar162._0_4_ = auVar143._0_4_ + auVar169._0_4_;
                auVar162._4_4_ = auVar143._4_4_ + auVar169._4_4_;
                auVar162._8_4_ = auVar143._8_4_ + auVar169._8_4_;
                auVar162._12_4_ = auVar143._12_4_ + auVar169._12_4_;
                auVar165._16_4_ = auVar143._16_4_ + auVar169._16_4_;
                auVar165._0_16_ = auVar162;
                auVar165._20_4_ = auVar143._20_4_ + auVar169._20_4_;
                auVar165._24_4_ = auVar143._24_4_ + auVar169._24_4_;
                auVar165._28_4_ = auVar143._28_4_ + auVar169._28_4_;
                uVar36 = uVar36 + 8;
                auVar166 = ZEXT3264(auVar165);
              } while ((uVar37 + 8 & 0x1fffffff8) != uVar36);
              auVar94 = vorps_avx(auVar80,auVar95);
              auVar115._0_8_ = auVar88._0_8_ ^ 0x8000000000000000;
              auVar115._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar94 = vpcmpgtq_avx(auVar115,auVar94);
              auVar79 = vpackssdw_avx(auVar94,auVar107);
              auVar94 = vorps_avx(auVar80,auVar95);
              auVar141._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
              auVar141._8_4_ = auVar119._8_4_;
              auVar141._12_4_ = auVar119._12_4_ ^ 0x80000000;
              auVar94 = vpcmpgtq_avx(auVar141,auVar94);
              auVar94 = vpackssdw_avx(auVar94,auVar82);
              auVar94 = vblendvps_avx(auVar169._0_16_,auVar162,auVar94 ^ auVar96);
              auVar79 = vblendvps_avx(auVar169._16_16_,auVar165._16_16_,auVar79 ^ auVar96);
              auVar94 = vhaddps_avx(auVar79,auVar94);
              auVar94 = vhaddps_avx(auVar94,auVar94);
              auVar94 = vhaddps_avx(auVar94,auVar94);
              auVar166 = ZEXT1664(auVar94);
            }
            fVar151 = auVar166._0_4_;
            uVar39 = uVar39 + 1;
          } while (uVar39 != uVar29);
        }
        pfVar23 = (float *)(*(long *)(&this->field_0xf0 + (long)p_Var2) * lVar40 +
                           *(long *)(&this->field_0xe0 + (long)p_Var2));
        pfVar25 = (float *)(lVar40 * *(long *)(&this->field_0x138 + (long)p_Var2) +
                           *(long *)(&this->field_0x128 + (long)p_Var2));
        fVar151 = fVar151 * fVar150;
        if (0 < (int)uVar21) {
          auVar94 = vpermilps_avx(ZEXT416((uint)fVar151),0);
          auVar181._16_16_ = auVar94;
          auVar181._0_16_ = auVar94;
          auVar166 = ZEXT464(0) << 0x40;
          uVar39 = 0;
          do {
            pauVar38 = (undefined1 (*) [32])((long)pvVar4 + uVar20 * uVar30 * uVar39 + lVar22);
            if ((int)uVar33 < 8) {
              auVar184 = SUB6432(ZEXT864(0),0);
              uVar27 = 0;
            }
            else {
              auVar169 = ZEXT864(0);
              iVar26 = 7;
              do {
                auVar119 = vsubps_avx(*pauVar38,auVar181);
                auVar184._0_4_ = auVar169._0_4_ + auVar119._0_4_ * auVar119._0_4_;
                auVar184._4_4_ = auVar169._4_4_ + auVar119._4_4_ * auVar119._4_4_;
                auVar184._8_4_ = auVar169._8_4_ + auVar119._8_4_ * auVar119._8_4_;
                auVar184._12_4_ = auVar169._12_4_ + auVar119._12_4_ * auVar119._12_4_;
                auVar184._16_4_ = auVar169._16_4_ + auVar119._16_4_ * auVar119._16_4_;
                auVar184._20_4_ = auVar169._20_4_ + auVar119._20_4_ * auVar119._20_4_;
                auVar184._24_4_ = auVar169._24_4_ + auVar119._24_4_ * auVar119._24_4_;
                auVar184._28_4_ = auVar169._28_4_ + auVar119._28_4_;
                auVar169 = ZEXT3264(auVar184);
                pauVar38 = pauVar38 + 1;
                iVar26 = iVar26 + 8;
                uVar27 = uVar31;
              } while (iVar26 < (int)uVar33);
            }
            uVar34 = uVar27 | 3;
            auVar191 = ZEXT816(0) << 0x40;
            while( true ) {
              fVar170 = auVar191._4_4_;
              fVar171 = auVar191._8_4_;
              fVar172 = auVar191._12_4_;
              if ((int)uVar33 <= (int)uVar34) break;
              auVar79 = vsubps_avx(*(undefined1 (*) [16])*pauVar38,auVar94);
              auVar191._0_4_ = auVar191._0_4_ + auVar79._0_4_ * auVar79._0_4_;
              auVar191._4_4_ = fVar170 + auVar79._4_4_ * auVar79._4_4_;
              auVar191._8_4_ = fVar171 + auVar79._8_4_ * auVar79._8_4_;
              auVar191._12_4_ = fVar172 + auVar79._12_4_ * auVar79._12_4_;
              pauVar38 = (undefined1 (*) [32])(*pauVar38 + 0x10);
              uVar34 = uVar27 + 7;
              uVar27 = uVar27 + 4;
            }
            auVar56._0_4_ = auVar184._0_4_ + auVar184._16_4_;
            auVar56._4_4_ = auVar184._4_4_ + auVar184._20_4_;
            auVar56._8_4_ = auVar184._8_4_ + auVar184._24_4_;
            auVar56._12_4_ = auVar184._12_4_ + auVar184._28_4_;
            auVar79 = vshufpd_avx(auVar56,auVar56,1);
            auVar57._0_4_ = auVar79._0_4_ + auVar56._0_4_;
            auVar57._4_4_ = auVar79._4_4_ + auVar56._4_4_;
            auVar57._8_4_ = auVar79._8_4_ + auVar56._8_4_;
            auVar57._12_4_ = auVar79._12_4_ + auVar56._12_4_;
            auVar79 = vmovshdup_avx(auVar57);
            auVar81 = vshufpd_avx(auVar191,auVar191,1);
            auVar129._0_4_ = auVar191._0_4_ + auVar81._0_4_;
            auVar129._4_4_ = fVar170 + auVar81._4_4_;
            auVar129._8_4_ = fVar171 + auVar81._8_4_;
            auVar129._12_4_ = fVar172 + auVar81._12_4_;
            auVar81 = vmovshdup_avx(auVar129);
            fVar170 = auVar81._0_4_ +
                      auVar166._0_4_ + auVar79._0_4_ + auVar57._0_4_ + auVar129._0_4_;
            auVar166 = ZEXT464((uint)fVar170);
            if ((int)uVar27 < (int)uVar33) {
              uVar37 = CONCAT44(0,~uVar27 + uVar33);
              auVar79 = vblendps_avx(ZEXT416((uint)fVar170),_DAT_00594030,0xe);
              auVar58._8_8_ = 0;
              auVar58._0_8_ = uVar37;
              auVar106 = vpshufd_avx(auVar58,0x44);
              auVar81 = vorps_avx(auVar106,auVar95);
              auVar80 = vorps_avx(auVar106,auVar95);
              uVar36 = 0;
              auVar92 = ZEXT1664(auVar79);
              do {
                auVar166 = auVar92;
                auVar59._8_8_ = 0;
                auVar59._0_8_ = uVar36;
                auVar79 = vpshufd_avx(auVar59,0x44);
                auVar71._16_16_ = auVar79;
                auVar71._0_16_ = auVar79;
                auVar119 = vorps_avx(auVar71,auVar18);
                auVar88 = vorps_avx(auVar71,auVar19);
                auVar79 = vorps_avx(auVar106,auVar95);
                auVar60._0_8_ = auVar88._16_8_ ^ 0x8000000000000000;
                auVar60._8_4_ = auVar88._24_4_;
                auVar60._12_4_ = auVar88._28_4_ ^ 0x80000000;
                auVar82 = vpcmpgtq_avx(auVar60,auVar79);
                auVar182._0_8_ = auVar88._0_8_ ^ 0x8000000000000000;
                auVar130._8_4_ = auVar88._8_4_;
                auVar182._8_4_ = auVar130._8_4_;
                auVar182._12_4_ = auVar88._12_4_ ^ 0x80000000;
                auVar107 = vpcmpgtq_avx(auVar182,auVar81);
                auVar107 = vpackssdw_avx(auVar107,auVar82);
                auVar84._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
                auVar84._8_4_ = auVar119._24_4_;
                auVar84._12_4_ = auVar119._28_4_ ^ 0x80000000;
                auVar108 = vpcmpgtq_avx(auVar84,auVar79);
                auVar85._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
                auVar85._8_4_ = auVar119._8_4_;
                auVar85._12_4_ = auVar119._12_4_ ^ 0x80000000;
                auVar79 = vpcmpgtq_avx(auVar85,auVar80);
                auVar79 = vpackssdw_avx(auVar79,auVar108);
                auVar79 = vpackssdw_avx(auVar79 ^ auVar96,auVar107 ^ auVar96);
                auVar107 = vpmovsxwd_avx(auVar79);
                auVar79 = vpunpckhwd_avx(auVar79,auVar79);
                auVar89._16_16_ = auVar79;
                auVar89._0_16_ = auVar107;
                auVar143 = vmaskmovps_avx(auVar89,*(undefined1 (*) [32])(*pauVar38 + uVar36 * 4));
                auVar143 = vsubps_avx(auVar143,auVar181);
                auVar183._0_4_ = auVar143._0_4_ * auVar143._0_4_ + auVar166._0_4_;
                auVar183._4_4_ = auVar143._4_4_ * auVar143._4_4_ + auVar166._4_4_;
                auVar183._8_4_ = auVar143._8_4_ * auVar143._8_4_ + auVar166._8_4_;
                auVar183._12_4_ = auVar143._12_4_ * auVar143._12_4_ + auVar166._12_4_;
                auVar185._16_4_ = auVar143._16_4_ * auVar143._16_4_ + auVar166._16_4_;
                auVar185._0_16_ = auVar183;
                auVar185._20_4_ = auVar143._20_4_ * auVar143._20_4_ + auVar166._20_4_;
                auVar185._24_4_ = auVar143._24_4_ * auVar143._24_4_ + auVar166._24_4_;
                auVar185._28_4_ = auVar143._28_4_ + auVar166._28_4_;
                uVar36 = uVar36 + 8;
                auVar92 = ZEXT3264(auVar185);
              } while ((uVar37 + 8 & 0x1fffffff8) != uVar36);
              auVar79 = vorps_avx(auVar106,auVar95);
              auVar130._0_8_ = auVar88._0_8_ ^ 0x8000000000000000;
              auVar130._12_4_ = auVar88._12_4_ ^ 0x80000000;
              auVar79 = vpcmpgtq_avx(auVar130,auVar79);
              auVar81 = vpackssdw_avx(auVar79,auVar82);
              auVar79 = vorps_avx(auVar106,auVar95);
              auVar131._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
              auVar131._8_4_ = auVar119._8_4_;
              auVar131._12_4_ = auVar119._12_4_ ^ 0x80000000;
              auVar79 = vpcmpgtq_avx(auVar131,auVar79);
              auVar79 = vpackssdw_avx(auVar79,auVar108);
              auVar79 = vblendvps_avx(auVar166._0_16_,auVar183,auVar79 ^ auVar96);
              auVar92 = ZEXT1664(auVar79);
              auVar81 = vblendvps_avx(auVar166._16_16_,auVar185._16_16_,auVar81 ^ auVar96);
              auVar79 = vhaddps_avx(auVar81,auVar79);
              auVar79 = vhaddps_avx(auVar79,auVar79);
              auVar79 = vhaddps_avx(auVar79,auVar79);
              auVar166 = ZEXT1664(auVar79);
            }
            fVar170 = auVar166._0_4_;
            uVar39 = uVar39 + 1;
          } while (uVar39 != uVar29);
        }
        fVar170 = fVar170 * fVar150 + *(float *)(&this->field_0xd8 + (long)pp_Var3[-3]);
        auVar94 = vrsqrtss_avx(ZEXT416((uint)fVar170),ZEXT416((uint)fVar170));
        fVar171 = auVar94._0_4_;
        if (0 < (int)uVar21) {
          fVar170 = fVar171 * -0.5 * (fVar170 * fVar171 * fVar171 + -3.0);
          fVar151 = fVar170 * -fVar151;
          uVar39 = 0;
          do {
            fVar172 = fVar170;
            fVar171 = fVar151;
            if (*(int *)(&this->field_0xdc + (long)pp_Var3[-3]) != 0) {
              fVar172 = fVar170 * *pfVar23;
              fVar171 = fVar151 * *pfVar23;
              auVar92 = ZEXT464((uint)fVar171);
              fVar171 = fVar171 + *pfVar25;
            }
            pauVar38 = (undefined1 (*) [32])((long)pvVar4 + uVar20 * uVar30 * uVar39 + lVar22);
            auVar94 = vshufps_avx(ZEXT416((uint)fVar172),ZEXT416((uint)fVar172),0);
            auVar79 = vshufps_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),0);
            fVar172 = auVar79._0_4_;
            fVar173 = auVar79._4_4_;
            fVar174 = auVar79._8_4_;
            fVar175 = auVar79._12_4_;
            fVar176 = auVar94._0_4_;
            fVar167 = auVar94._4_4_;
            fVar144 = auVar94._8_4_;
            fVar171 = auVar94._12_4_;
            uVar27 = 0;
            if (7 < (int)uVar33) {
              iVar26 = 7;
              do {
                auVar90._0_4_ = fVar176 * *(float *)*pauVar38 + fVar172;
                auVar90._4_4_ = fVar167 * *(float *)(*pauVar38 + 4) + fVar173;
                auVar90._8_4_ = fVar144 * *(float *)(*pauVar38 + 8) + fVar174;
                auVar90._12_4_ = fVar171 * *(float *)(*pauVar38 + 0xc) + fVar175;
                auVar90._16_4_ = fVar176 * *(float *)(*pauVar38 + 0x10) + fVar172;
                auVar90._20_4_ = fVar167 * *(float *)(*pauVar38 + 0x14) + fVar173;
                auVar90._24_4_ = fVar144 * *(float *)(*pauVar38 + 0x18) + fVar174;
                auVar90._28_4_ = auVar92._28_4_ + fVar175;
                auVar92 = ZEXT3264(auVar90);
                *pauVar38 = auVar90;
                pauVar38 = pauVar38 + 1;
                iVar26 = iVar26 + 8;
                uVar27 = uVar31;
              } while (iVar26 < (int)uVar33);
            }
            uVar34 = uVar27 | 3;
            while ((int)uVar34 < (int)uVar33) {
              fVar149 = *(float *)(*pauVar38 + 4);
              fVar152 = *(float *)(*pauVar38 + 8);
              fVar153 = *(float *)(*pauVar38 + 0xc);
              *(float *)*pauVar38 = fVar172 + fVar176 * *(float *)*pauVar38;
              *(float *)(*pauVar38 + 4) = fVar173 + fVar167 * fVar149;
              *(float *)(*pauVar38 + 8) = fVar174 + fVar144 * fVar152;
              *(float *)(*pauVar38 + 0xc) = fVar175 + fVar171 * fVar153;
              pauVar38 = (undefined1 (*) [32])(*pauVar38 + 0x10);
              uVar34 = uVar27 + 7;
              uVar27 = uVar27 + 4;
            }
            if ((int)uVar27 < (int)uVar33) {
              uVar36 = CONCAT44(0,~uVar27 + uVar33);
              auVar61._8_8_ = 0;
              auVar61._0_8_ = uVar36;
              auVar81 = vpshufd_avx(auVar61,0x44);
              auVar94 = vorps_avx(auVar81,auVar95);
              auVar79 = vorps_avx(auVar81,auVar95);
              uVar37 = 0;
              do {
                auVar62._8_8_ = 0;
                auVar62._0_8_ = uVar37;
                auVar80 = vpshufd_avx(auVar62,0x44);
                auVar72._16_16_ = auVar80;
                auVar72._0_16_ = auVar80;
                auVar119 = vorps_avx(auVar72,auVar18);
                auVar88 = vorps_avx(auVar72,auVar19);
                auVar80 = vorps_avx(auVar81,auVar95);
                auVar132._0_8_ = auVar88._16_8_ ^ 0x8000000000000000;
                auVar132._8_4_ = auVar88._24_4_;
                auVar132._12_4_ = auVar88._28_4_ ^ 0x80000000;
                auVar106 = vpcmpgtq_avx(auVar132,auVar80);
                auVar63._0_8_ = auVar88._0_8_ ^ 0x8000000000000000;
                auVar63._8_4_ = auVar88._8_4_;
                auVar63._12_4_ = auVar88._12_4_ ^ 0x80000000;
                auVar107 = vpcmpgtq_avx(auVar63,auVar94);
                auVar106 = vpackssdw_avx(auVar107,auVar106);
                auVar133._0_8_ = auVar119._16_8_ ^ 0x8000000000000000;
                auVar133._8_4_ = auVar119._24_4_;
                auVar133._12_4_ = auVar119._28_4_ ^ 0x80000000;
                auVar80 = vpcmpgtq_avx(auVar133,auVar80);
                auVar86._0_8_ = auVar119._0_8_ ^ 0x8000000000000000;
                auVar86._8_4_ = auVar119._8_4_;
                auVar86._12_4_ = auVar119._12_4_ ^ 0x80000000;
                auVar107 = vpcmpgtq_avx(auVar86,auVar79);
                auVar80 = vpackssdw_avx(auVar107,auVar80);
                auVar80 = vpackssdw_avx(auVar80 ^ auVar96,auVar106 ^ auVar96);
                auVar106 = vpmovsxwd_avx(auVar80);
                auVar80 = vpunpckhwd_avx(auVar80,auVar80);
                auVar73._16_16_ = auVar80;
                auVar73._0_16_ = auVar106;
                auVar119 = vmaskmovps_avx(auVar73,*(undefined1 (*) [32])(*pauVar38 + uVar37 * 4));
                auVar91._0_4_ = fVar172 + fVar176 * auVar119._0_4_;
                auVar91._4_4_ = fVar173 + fVar167 * auVar119._4_4_;
                auVar91._8_4_ = fVar174 + fVar144 * auVar119._8_4_;
                auVar91._12_4_ = fVar175 + fVar171 * auVar119._12_4_;
                auVar91._16_4_ = fVar172 + fVar176 * auVar119._16_4_;
                auVar91._20_4_ = fVar173 + fVar167 * auVar119._20_4_;
                auVar91._24_4_ = fVar174 + fVar144 * auVar119._24_4_;
                auVar91._28_4_ = fVar175 + auVar119._28_4_;
                auVar92 = ZEXT3264(auVar91);
                auVar119 = vmaskmovps_avx(auVar73,auVar91);
                *(undefined1 (*) [32])(*pauVar38 + uVar37 * 4) = auVar119;
                uVar37 = uVar37 + 8;
              } while ((uVar36 + 8 & 0x1fffffff8) != uVar37);
            }
            pfVar23 = pfVar23 + 1;
            pfVar25 = pfVar25 + 1;
            uVar39 = uVar39 + 1;
          } while (uVar39 != uVar29);
        }
        lVar35 = lVar35 + 1;
        p_Var2 = pp_Var1[-3];
      } while (lVar35 < *(int *)(&this->field_0xd0 + (long)p_Var2));
    }
  }
  return 0;
}

Assistant:

int GroupNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}